

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O0

void __thiscall PathTracerThread::viewer_thread_func(PathTracerThread *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  void *__stat_loc;
  Fence *in_RDI;
  VkFenceCreateFlags unaff_retaddr;
  Ptr<Device> *in_stack_00000008;
  VkCommandBufferLevel in_stack_00000014;
  Ptr<CommandPool> *in_stack_00000018;
  shared_ptr<myvk::CommandBuffer> viewer_command_buffer;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandPool> main_command_pool;
  shared_ptr<PathTracer> *path_tracer;
  shared_ptr<myvk::Device> *device;
  shared_ptr<myvk::CommandBuffer> *in_stack_000001e8;
  PathTracerViewer *in_stack_000001f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  VkCommandBufferUsageFlags in_stack_ffffffffffffffac;
  CommandBuffer *in_stack_ffffffffffffffb0;
  
  spdlog::info<char[32]>((char (*) [32])0x1805ef);
  this_01 = &(in_RDI->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  peVar2 = std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x180602);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x18061d);
  PathTracerViewer::GetPathTracerPtr(this_00);
  uVar3 = 0;
  myvk::CommandPool::Create((Ptr<Queue> *)in_stack_00000018,in_stack_00000014);
  myvk::Fence::Create(in_stack_00000008,unaff_retaddr);
  while( true ) {
    bVar1 = std::atomic<bool>::load((atomic<bool> *)this_01,(memory_order)((ulong)in_RDI >> 0x20));
    if (!bVar1) break;
    myvk::CommandBuffer::Create(in_stack_00000018,in_stack_00000014);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x180692);
    myvk::CommandBuffer::Begin(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1806a8);
    PathTracerViewer::CmdGenRenderPass(in_stack_000001f0,in_stack_000001e8);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1806c1);
    myvk::CommandBuffer::End((CommandBuffer *)0x1806c9);
    std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1806d5);
    myvk::Fence::Reset(in_RDI);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1806e9);
    myvk::CommandBuffer::Submit
              (viewer_command_buffer.
               super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (Ptr<Fence> *)in_stack_00000018);
    std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x180702);
    __stat_loc = (void *)0xffffffffffffffff;
    myvk::Fence::Wait((Fence *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),(uint64_t)this_01);
    std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x18071d);
    spdlog::debug<char[24]>((char (*) [24])0x180729);
    binary_semaphore::wait
              ((binary_semaphore *)
               &in_RDI[3].super_DeviceObjectBase.super_Base.
                super_enable_shared_from_this<myvk::Base>._M_weak_this.
                super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__stat_loc);
  }
  spdlog::info<char[31]>((char (*) [31])0x180789);
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x180795);
  std::shared_ptr<myvk::CommandPool>::~shared_ptr((shared_ptr<myvk::CommandPool> *)0x18079f);
  return;
}

Assistant:

void PathTracerThread::viewer_thread_func() {
	spdlog::info("Enter path tracer viewer thread");

	const std::shared_ptr<myvk::Device> &device = m_main_queue->GetDevicePtr();
	const std::shared_ptr<PathTracer> &path_tracer = m_path_tracer_viewer_ptr->GetPathTracerPtr();

	std::shared_ptr<myvk::CommandPool> main_command_pool = myvk::CommandPool::Create(m_main_queue);

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	while (m_run.load(std::memory_order_acquire)) {
		{
			std::shared_ptr<myvk::CommandBuffer> viewer_command_buffer = myvk::CommandBuffer::Create(main_command_pool);
			viewer_command_buffer->Begin();
			m_path_tracer_viewer_ptr->CmdGenRenderPass(viewer_command_buffer);
			viewer_command_buffer->End();

			fence->Reset();
			viewer_command_buffer->Submit(fence);
			fence->Wait();
		}

		spdlog::debug("m_viewer_semaphore wait");
		m_viewer_semaphore.wait();
	}

	spdlog::info("Quit path tracer viewer thread");
}